

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O0

void __thiscall wasm::FunctionValidator::visitThrow(FunctionValidator *this,Throw *curr)

{
  Type left;
  Type right;
  bool bVar1;
  Module *pMVar2;
  Tag *pTVar3;
  size_t sVar4;
  size_t sVar5;
  Type *pTVar6;
  Expression **ppEVar7;
  ostream *poVar8;
  Type *param;
  Iterator __end1;
  Iterator __begin1;
  Type *__range1;
  size_t i;
  Tag *tag;
  Type local_20;
  Throw *local_18;
  Throw *curr_local;
  FunctionValidator *this_local;
  
  local_18 = curr;
  curr_local = (Throw *)this;
  pMVar2 = Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::getModule
                     (&(this->
                       super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                       ).
                       super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                       .
                       super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                     );
  bVar1 = FeatureSet::hasExceptionHandling(&pMVar2->features);
  shouldBeTrue<wasm::Throw*>
            (this,bVar1,local_18,"throw requires exception-handling [--enable-exception-handling]");
  local_20.id = (local_18->super_SpecificExpression<(wasm::Expression::Id)50>).super_Expression.type
                .id;
  wasm::Type::Type((Type *)&tag,unreachable);
  shouldBeEqual<wasm::Throw*,wasm::Type>
            (this,local_20,(Type)tag,local_18,"throw\'s type must be unreachable");
  if ((this->info->validateGlobally & 1U) != 0) {
    pMVar2 = Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::
             getModule(&(this->
                        super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                        ).
                        super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                        .
                        super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                      );
    pTVar3 = Module::getTagOrNull(pMVar2,(Name)(local_18->tag).super_IString.str);
    bVar1 = shouldBeTrue<wasm::Throw*>(this,pTVar3 != (Tag *)0x0,local_18,"throw\'s tag must exist")
    ;
    if (bVar1) {
      sVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                        (&(local_18->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                        );
      sVar5 = wasm::Type::size(&(pTVar3->sig).params);
      bVar1 = shouldBeTrue<wasm::Throw*>
                        (this,sVar4 == sVar5,local_18,"tag\'s param numbers must match");
      if (bVar1) {
        __range1 = (Type *)0x0;
        join_0x00000010_0x00000000_ =
             (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
             wasm::Type::begin(&(pTVar3->sig).params);
        _param = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
                 wasm::Type::end(&(pTVar3->sig).params);
        while (bVar1 = ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator!=
                                 ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                                  &__end1.
                                   super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                   .index,(ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                           *)&param), bVar1) {
          pTVar6 = wasm::Type::Iterator::operator*
                             ((Iterator *)
                              &__end1.
                               super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                               index);
          ppEVar7 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                              (&(local_18->operands).
                                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                               ,(size_t)__range1);
          left.id = ((*ppEVar7)->type).id;
          right.id = pTVar6->id;
          ppEVar7 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                              (&(local_18->operands).
                                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                               ,(size_t)__range1);
          bVar1 = shouldBeSubType(this,left,right,*ppEVar7,"tag param types must match");
          if ((!bVar1) && ((this->info->quiet & 1U) == 0)) {
            poVar8 = getStream(this);
            poVar8 = std::operator<<(poVar8,"(on argument ");
            poVar8 = (ostream *)std::ostream::operator<<(poVar8,(ulong)__range1);
            std::operator<<(poVar8,")\n");
          }
          __range1 = (Type *)((long)&__range1->id + 1);
          ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator++
                    ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                     &__end1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                      index);
        }
      }
    }
  }
  return;
}

Assistant:

void FunctionValidator::visitThrow(Throw* curr) {
  shouldBeTrue(
    getModule()->features.hasExceptionHandling(),
    curr,
    "throw requires exception-handling [--enable-exception-handling]");
  shouldBeEqual(curr->type,
                Type(Type::unreachable),
                curr,
                "throw's type must be unreachable");
  if (!info.validateGlobally) {
    return;
  }
  auto* tag = getModule()->getTagOrNull(curr->tag);
  if (!shouldBeTrue(!!tag, curr, "throw's tag must exist")) {
    return;
  }
  if (!shouldBeTrue(curr->operands.size() == tag->sig.params.size(),
                    curr,
                    "tag's param numbers must match")) {
    return;
  }
  size_t i = 0;
  for (const auto& param : tag->sig.params) {
    if (!shouldBeSubType(curr->operands[i]->type,
                         param,
                         curr->operands[i],
                         "tag param types must match") &&
        !info.quiet) {
      getStream() << "(on argument " << i << ")\n";
    }
    ++i;
  }
}